

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

int __thiscall minihttp::TcpSocket::_readBytes(TcpSocket *this,uchar *buf,size_t maxlen)

{
  ssize_t sVar1;
  size_t maxlen_local;
  uchar *buf_local;
  TcpSocket *this_local;
  
  sVar1 = recv((int)this->_s,buf,maxlen,0);
  return (int)sVar1;
}

Assistant:

int TcpSocket::_readBytes(unsigned char *buf, size_t maxlen)
{
#ifdef MINIHTTP_USE_MBEDTLS
    if(_sslctx)
        return mbedtls_ssl_read(&((SSLCtx*)_sslctx)->ssl, buf, maxlen);
    else
        return mbedtls_net_recv(&_s, buf, maxlen);
#else
    return recv(_s, (char*)buf, maxlen, 0); // last char is used as string terminator
#endif
}